

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseDefault(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  bool bVar1;
  Parsekey PVar2;
  int iVar3;
  string *psVar4;
  HighsLogOptions *in_RSI;
  HMpsFF *in_RDI;
  string *in_stack_00000008;
  size_t *in_stack_00000010;
  size_t *in_stack_00000018;
  string *in_stack_00000020;
  HMpsFF *in_stack_00000028;
  string sense;
  Parsekey key;
  size_t e;
  size_t s;
  bool skip;
  string word;
  string strline;
  HMpsFF *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  string local_d0 [32];
  string local_b0 [32];
  undefined4 in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *psVar5;
  byte local_61;
  string local_60 [32];
  string local_40 [40];
  HighsLogOptions *local_18;
  Parsekey local_4;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  bVar1 = getMpsLine(in_RDI,(istream *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                     ,in_stack_ffffffffffffff08,(bool *)in_stack_ffffffffffffff00);
  if (bVar1) {
    if ((local_61 & 1) == 0) {
      bVar1 = timeout(in_stack_ffffffffffffff00);
      if (bVar1) {
        local_4 = kTimeout;
      }
      else {
        PVar2 = checkFirstWord(in_stack_00000028,in_stack_00000020,in_stack_00000018,
                               in_stack_00000010,in_stack_00000008);
        if (PVar2 == kName) {
          psVar5 = in_stack_ffffffffffffff78;
          psVar4 = (string *)std::__cxx11::string::length();
          if (in_stack_ffffffffffffff78 < psVar4) {
            first_word(psVar5,CONCAT44(PVar2,in_stack_ffffffffffffff70));
            std::__cxx11::string::operator=((string *)&in_RDI->mps_name,local_b0);
            std::__cxx11::string::~string(local_b0);
          }
          highsLogDev(local_18,kInfo,"readMPS: Read NAME    OK\n");
          local_4 = kNone;
        }
        else {
          local_4 = PVar2;
          if ((PVar2 == kObjsense) &&
             (psVar5 = in_stack_ffffffffffffff78, psVar4 = (string *)std::__cxx11::string::length(),
             local_4 = PVar2, in_stack_ffffffffffffff78 < psVar4)) {
            first_word(psVar5,CONCAT44(PVar2,in_stack_ffffffffffffff70));
            toupper((int)local_d0);
            iVar3 = std::__cxx11::string::compare((char *)local_d0);
            if (iVar3 == 0) {
              in_RDI->obj_sense = kMaximize;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)local_d0);
              if (iVar3 == 0) {
                in_RDI->obj_sense = kMinimize;
              }
            }
            std::__cxx11::string::~string(local_d0);
            local_4 = PVar2;
          }
        }
      }
    }
    else {
      local_4 = kComment;
    }
  }
  else {
    local_4 = kFail;
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseDefault(const HighsLogOptions& log_options,
                                      std::istream& file) {
  std::string strline, word;
  bool skip;
  if (getMpsLine(file, strline, skip)) {
    if (skip) return HMpsFF::Parsekey::kComment;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t s, e;
    HMpsFF::Parsekey key = checkFirstWord(strline, s, e, word);
    if (key == HMpsFF::Parsekey::kName) {
      // Save name of the MPS file
      if (e < strline.length()) {
        mps_name = first_word(strline, e);
      }
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read NAME    OK\n");
      return HMpsFF::Parsekey::kNone;
    }

    if (key == HMpsFF::Parsekey::kObjsense) {
      // Look for Gurobi-style definition of MAX/MIN on OBJSENSE line
      if (e < strline.length()) {
        std::string sense = first_word(strline, e);
        // Convert to upper case
        toupper(sense);
        if (sense.compare("MAX") == 0) {
          // Found MAX sense on OBJSENSE line
          obj_sense = ObjSense::kMaximize;
        } else if (sense.compare("MIN") == 0) {
          // Found MIN sense on OBJSENSE line
          obj_sense = ObjSense::kMinimize;
        }
        // Don't return HMpsFF::Parsekey::kNone; in case there's a
        // redefinition of OBJSENSE on the "proper" line. If there's
        // no such line, the ROWS keyword is read OK
      }
    }

    return key;
  }
  return HMpsFF::Parsekey::kFail;
}